

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall
QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>::~QExplicitlySharedDataPointer
          (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate> *this)

{
  QDnsTlsAssociationRecordPrivate *pQVar1;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QDnsTlsAssociationRecordPrivate *)0x0) {
    LOCK();
    (pQVar1->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(pQVar1->super_QDnsRecordPrivate).super_QSharedData.ref.
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1);
    UNLOCK();
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
      pQVar1 = (this->d).ptr;
      if (pQVar1 != (QDnsTlsAssociationRecordPrivate *)0x0) {
        QDnsTlsAssociationRecordPrivate::~QDnsTlsAssociationRecordPrivate(pQVar1);
      }
      operator_delete(pQVar1,0x40);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }